

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_-1,_-1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>,_4,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,__1,__1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
           *kernel)

{
  Index IVar1;
  long *plVar2;
  long local_80;
  long local_78;
  Index inner_2;
  Index inner_1;
  Index inner;
  Index alignedEnd;
  Index outer;
  Index alignedStart;
  Index alignedStep;
  Index outerSize;
  Index innerSize;
  Index packetAlignedMask;
  Scalar *dst_ptr;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,__1,__1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
  *kernel_local;
  long *local_10;
  
  dst_ptr = (Scalar *)kernel;
  packetAlignedMask =
       (Index)generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_-1,_-1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
              ::dstDataPtr(kernel);
  if ((packetAlignedMask & 3U) == 0) {
    innerSize = 3;
    outerSize = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_-1,_-1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
                ::innerSize((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,__1,__1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
                             *)dst_ptr);
    alignedStep = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_-1,_-1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
                  ::outerSize((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,__1,__1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
                               *)dst_ptr);
    IVar1 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_-1,_-1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
            ::outerStride((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,__1,__1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
                           *)dst_ptr);
    alignedStart = 4U - IVar1 % 4 & 3;
    outer = first_aligned<16,float,long>((float *)packetAlignedMask,outerSize);
    for (alignedEnd = 0; alignedEnd < alignedStep; alignedEnd = alignedEnd + 1) {
      inner = outer + (outerSize - outer & 0xfffffffffffffffcU);
      for (inner_1 = 0; inner_1 < outer; inner_1 = inner_1 + 1) {
        generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_-1,_-1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
        ::assignCoeffByOuterInner
                  ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,__1,__1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
                    *)dst_ptr,alignedEnd,inner_1);
      }
      for (inner_2 = outer; inner_2 < inner; inner_2 = inner_2 + 4) {
        generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>,-1,-1,false>,-1,-1,false>>,Eigen::internal::evaluator<Eigen::Block<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,-1,0,-1,1>const>const,Eigen::Matrix<float,-1,-1,0,-1,1>const>const,-1,-1,false>>,Eigen::internal::sub_assign_op<float,float>,0>
        ::assignPacketByOuterInner<16,0,float__vector(4)>
                  ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,_1,_1,false>>,Eigen::internal::evaluator<Eigen::Block<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,1>const>const,Eigen::Matrix<float,_1,_1,0,_1,1>const>const,_1,_1,false>>,Eigen::internal::sub_assign_op<float,float>,0>
                    *)dst_ptr,alignedEnd,inner_2);
      }
      for (local_78 = inner; local_78 < outerSize; local_78 = local_78 + 1) {
        generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_-1,_-1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
        ::assignCoeffByOuterInner
                  ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,__1,__1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
                    *)dst_ptr,alignedEnd,local_78);
      }
      local_80 = (outer + alignedStart) % 4;
      local_10 = &local_80;
      kernel_local = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,__1,__1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
                      *)&outerSize;
      plVar2 = std::min<long>(local_10,(long *)kernel_local);
      outer = *plVar2;
    }
  }
  else {
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>,_-1,_-1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>,_0,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>,__1,__1,_false>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
           *)dst_ptr);
  }
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    typedef typename Kernel::Scalar Scalar;
    typedef typename Kernel::PacketType PacketType;
    enum {
      packetSize = unpacket_traits<PacketType>::size,
      requestedAlignment = int(Kernel::AssignmentTraits::InnerRequiredAlignment),
      alignable = packet_traits<Scalar>::AlignedOnScalar || int(Kernel::AssignmentTraits::DstAlignment)>=sizeof(Scalar),
      dstIsAligned = int(Kernel::AssignmentTraits::DstAlignment)>=int(requestedAlignment),
      dstAlignment = alignable ? int(requestedAlignment)
                               : int(Kernel::AssignmentTraits::DstAlignment)
    };
    const Scalar *dst_ptr = kernel.dstDataPtr();
    if((!bool(dstIsAligned)) && (UIntPtr(dst_ptr) % sizeof(Scalar))>0)
    {
      // the pointer is not aligned-on scalar, so alignment is not possible
      return dense_assignment_loop<Kernel,DefaultTraversal,NoUnrolling>::run(kernel);
    }
    const Index packetAlignedMask = packetSize - 1;
    const Index innerSize = kernel.innerSize();
    const Index outerSize = kernel.outerSize();
    const Index alignedStep = alignable ? (packetSize - kernel.outerStride() % packetSize) & packetAlignedMask : 0;
    Index alignedStart = ((!alignable) || bool(dstIsAligned)) ? 0 : internal::first_aligned<requestedAlignment>(dst_ptr, innerSize);

    for(Index outer = 0; outer < outerSize; ++outer)
    {
      const Index alignedEnd = alignedStart + ((innerSize-alignedStart) & ~packetAlignedMask);
      // do the non-vectorizable part of the assignment
      for(Index inner = 0; inner<alignedStart ; ++inner)
        kernel.assignCoeffByOuterInner(outer, inner);

      // do the vectorizable part of the assignment
      for(Index inner = alignedStart; inner<alignedEnd; inner+=packetSize)
        kernel.template assignPacketByOuterInner<dstAlignment, Unaligned, PacketType>(outer, inner);

      // do the non-vectorizable part of the assignment
      for(Index inner = alignedEnd; inner<innerSize ; ++inner)
        kernel.assignCoeffByOuterInner(outer, inner);

      alignedStart = numext::mini((alignedStart+alignedStep)%packetSize, innerSize);
    }
  }